

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseables.cpp
# Opt level: O3

TString * anon_unknown.dwarf_d867a7::AppendTypeName
                    (TString *s,char *argOrder,char *argType,int dim0,int dim1)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  char *pcVar6;
  char __c;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  byte local_45;
  byte local_44;
  
  bVar1 = *argOrder;
  bVar8 = true;
  if ((((bVar1 != 0x25) && (bVar1 != 0x40)) && ((bVar1 & 0xfd) != 0x24)) &&
     ((bVar1 != 0x2a && (bVar1 != 0x7e)))) {
    bVar8 = (bVar1 & 0xfd) == 0x21;
  }
  bVar2 = *argType;
  bVar9 = bVar1 != 0x5d;
  bVar10 = bVar1 != 0x2a;
  bVar11 = bVar1 != 0x7e;
  bVar12 = (bVar1 & 0xfd) == 0x21;
  bVar13 = bVar1 != 0x5b;
  uVar4 = dim1;
  uVar3 = dim0;
  if ((bVar1 == 0x5e) ||
     (((uVar4 = dim0, uVar3 = dim1, !bVar8 && (bVar1 != 0x5d)) && (bVar1 != 0x5b)))) {
LAB_003a6a99:
    dim1 = uVar3;
    dim0 = uVar4;
    pcVar6 = argOrder + (bVar1 == 0x5e);
    local_44 = argOrder[bVar1 == 0x5e];
    argOrder = pcVar6;
    local_45 = bVar2;
    if (bVar2 < 0x69) {
      switch(bVar2) {
      case 0x42:
        pcVar7 = "bool";
        break;
      case 0x43:
      case 0x45:
      case 0x47:
      case 0x48:
      case 0x4a:
      case 0x4b:
      case 0x4e:
      case 0x4f:
      case 0x50:
      case 0x51:
      case 0x52:
switchD_003a6acb_caseD_43:
        pcVar7 = "UNKNOWN_TYPE";
        break;
      case 0x44:
        pcVar7 = "double";
        break;
      case 0x46:
        pcVar7 = "float";
        break;
      case 0x49:
        pcVar7 = "int";
        break;
      case 0x4c:
        pcVar7 = "int64_t";
        break;
      case 0x4d:
        pcVar7 = "uint64_t";
        break;
      case 0x53:
        pcVar7 = "sampler";
        break;
      case 0x54:
        goto switchD_003a6acb_caseD_54;
      case 0x55:
        pcVar7 = "uint";
        break;
      default:
        if (bVar2 != 0x2d) goto switchD_003a6acb_caseD_43;
        pcVar7 = "void";
      }
    }
    else if (bVar2 == 0x69) {
LAB_003a6b89:
      pcVar6 = "Texture";
      if (bVar12 || !bVar11) {
        pcVar6 = "RWTexture";
      }
      pcVar7 = "Buffer";
      if (bVar10 && bVar11) {
        pcVar7 = pcVar6;
      }
      pcVar6 = "SubpassInput";
      if (bVar13 && bVar9) {
        pcVar6 = pcVar7;
      }
      pcVar7 = "RWBuffer";
      if (bVar1 != 0x7e) {
        pcVar7 = pcVar6;
      }
      local_45 = 0x69;
      pcVar6 = argOrder;
    }
    else {
      if (bVar2 != 0x73) {
        if (bVar2 == 0x75) goto LAB_003a6b34;
        goto switchD_003a6acb_caseD_43;
      }
      pcVar7 = "SamplerComparisonState";
    }
  }
  else {
    local_44 = bVar1;
    if (bVar2 == 0x46) {
switchD_003a6acb_caseD_54:
      pcVar6 = "Texture";
      if (bVar12 || !bVar11) {
        pcVar6 = "RWTexture";
      }
      pcVar7 = "Buffer";
      if (bVar10 && bVar11) {
        pcVar7 = pcVar6;
      }
      pcVar6 = "SubpassInput";
      if (bVar13 && bVar9) {
        pcVar6 = pcVar7;
      }
      pcVar7 = "RWBuffer";
      if (bVar1 != 0x7e) {
        pcVar7 = pcVar6;
      }
      local_45 = 0x54;
      pcVar6 = argOrder;
    }
    else {
      if (bVar2 == 0x49) goto LAB_003a6b89;
      if (bVar2 != 0x55) goto LAB_003a6a99;
LAB_003a6b34:
      pcVar6 = "Texture";
      if (bVar12 || !bVar11) {
        pcVar6 = "RWTexture";
      }
      pcVar7 = "Buffer";
      if (bVar10 && bVar11) {
        pcVar7 = pcVar6;
      }
      pcVar6 = "SubpassInput";
      if (bVar13 && bVar9) {
        pcVar6 = pcVar7;
      }
      pcVar7 = "RWBuffer";
      if (bVar1 != 0x7e) {
        pcVar7 = pcVar6;
      }
      local_45 = 0x75;
      pcVar6 = argOrder;
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (s,pcVar7);
  if (bVar1 == 0x5d) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (s,"MS");
  }
  do {
    cVar5 = *pcVar6;
    if ((cVar5 == '\0') || (cVar5 == ',')) goto LAB_003a6d2f;
    uVar4 = (int)cVar5 - 0x30;
    pcVar6 = pcVar6 + 1;
  } while (9 < uVar4);
  if (uVar4 != 0) {
    dim0 = uVar4;
    dim1 = uVar4;
  }
LAB_003a6d2f:
  cVar5 = (char)dim0 + '0';
  if ((bool)(~bVar8 & (bVar2 & 0xdf) != 0x53)) {
    if ((local_44 == 0x56) || (local_44 == 0x4d)) {
      pcVar6 = "UNKNOWN_DIMENSION";
      if (dim0 - 5U < 0xfffffffc) goto LAB_003a6ead;
      __c = cVar5;
      if (local_44 != 0x56) {
        if (local_44 != 0x4d) goto LAB_003a6e51;
        if (dim1 - 5U < 0xfffffffc) goto LAB_003a6ead;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        push_back(s,cVar5);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        push_back(s,'x');
        __c = (char)dim1 + '0';
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      push_back(s,__c);
    }
  }
  else if (((!(bool)(~bVar8 & local_44 != 0x56)) && (bVar1 != 0x2a)) && (bVar1 != 0x7e)) {
    switch(dim0) {
    case 1:
      pcVar6 = "1D";
      break;
    case 2:
      pcVar6 = "2D";
      if (!bVar9 || (bVar1 & 0xfd) == 0x24) {
        pcVar6 = "2DMS";
      }
      break;
    case 3:
      pcVar6 = "3D";
      break;
    case 4:
      pcVar6 = "Cube";
      if (local_45 == 0x53) {
        pcVar6 = "CUBE";
      }
      break;
    default:
      pcVar6 = "UNKNOWN_SAMPLER";
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (s,pcVar6);
  }
LAB_003a6e51:
  if (((byte)(bVar1 - 0x23) < 0x1e & (byte)(0x20000009 >> (bVar1 - 0x23 & 0x1f))) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (s,"Array");
  }
  if (local_45 == 0x54) {
    pcVar6 = "<float";
  }
  else if (local_45 == 0x69) {
    pcVar6 = "<int";
  }
  else {
    if (local_45 != 0x75) {
      return s;
    }
    pcVar6 = "<uint";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (s,pcVar6);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  push_back(s,cVar5);
  pcVar6 = ">";
LAB_003a6ead:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (s,pcVar6);
  return s;
}

Assistant:

glslang::TString& AppendTypeName(glslang::TString& s, const char* argOrder, const char* argType, int dim0, int dim1)
{
    const bool isTranspose = (argOrder[0] == '^');
    const bool isTexture   = IsTextureType(argOrder[0]);
    const bool isArrayed   = IsArrayed(argOrder[0]);
    const bool isSampler   = IsSamplerType(argType[0]);
    const bool isMS        = IsMS(argOrder[0]);
    const bool isBuffer    = IsBuffer(argOrder[0]);
    const bool isImage     = IsImage(argOrder[0]);
    const bool isSubpass   = IsSubpassInput(argOrder[0]);

    char type  = *argType;

    if (isTranspose) {  // Take transpose of matrix dimensions
        std::swap(dim0, dim1);
    } else if (isTexture || isSubpass) {
        if (type == 'F')       // map base type to texture of that type.
            type = 'T';        // e.g, int -> itexture, uint -> utexture, etc.
        else if (type == 'I')
            type = 'i';
        else if (type == 'U')
            type = 'u';
    }

    if (isTranspose)
        ++argOrder;

    char order = *argOrder;

    switch (type) {
    case '-': s += "void";                                break;
    case 'F': s += "float";                               break;
    case 'D': s += "double";                              break;
    case 'I': s += "int";                                 break;
    case 'U': s += "uint";                                break;
    case 'L': s += "int64_t";                             break;
    case 'M': s += "uint64_t";                            break;
    case 'B': s += "bool";                                break;
    case 'S': s += "sampler";                             break;
    case 's': s += "SamplerComparisonState";              break;
    case 'T': s += ((isBuffer && isImage) ? "RWBuffer" :
                    isSubpass ? "SubpassInput" :
                    isBuffer ? "Buffer" :
                    isImage  ? "RWTexture" : "Texture");  break;
    case 'i': s += ((isBuffer && isImage) ? "RWBuffer" :
                    isSubpass ? "SubpassInput" :
                    isBuffer ? "Buffer" :
                    isImage ? "RWTexture" : "Texture");   break;
    case 'u': s += ((isBuffer && isImage) ? "RWBuffer" :
                    isSubpass ? "SubpassInput" :
                    isBuffer ? "Buffer" :
                    isImage ? "RWTexture" : "Texture");   break;
    default:  s += "UNKNOWN_TYPE";                        break;
    }

    if (isSubpass && isMS)
        s += "MS";

    // handle fixed vector sizes, such as float3, and only ever 3.
    const int fixedVecSize = FixedVecSize(argOrder);
    if (fixedVecSize != 0)
        dim0 = dim1 = fixedVecSize;

    const char dim0Char = ('0' + char(dim0));
    const char dim1Char = ('0' + char(dim1));

    // Add sampler dimensions
    if (isSampler || isTexture) {
        if ((order == 'V' || isTexture) && !isBuffer) {
            switch (dim0) {
            case 1: s += "1D";                   break;
            case 2: s += (isMS ? "2DMS" : "2D"); break;
            case 3: s += "3D";                   break;
            case 4: s += (type == 'S'? "CUBE" : "Cube"); break;
            default: s += "UNKNOWN_SAMPLER";     break;
            }
        }
    } else {
        // Non-sampler type:
        // verify dimensions
        if (((order == 'V' || order == 'M') && (dim0 < 1 || dim0 > 4)) ||
            (order == 'M' && (dim1 < 1 || dim1 > 4))) {
            s += "UNKNOWN_DIMENSION";
            return s;
        }

        switch (order) {
        case '-': break;  // no dimensions for voids
        case 'S': break;  // no dimensions on scalars
        case 'V':
            s += dim0Char;
            break;
        case 'M':
            s += dim0Char;
            s += 'x';
            s += dim1Char;
            break;
        default:
            break;
        }
    }

    // handle arrayed textures
    if (isArrayed)
        s += "Array";

    switch (type) {
    case 'i': s += "<int";   s += dim0Char; s += ">"; break;
    case 'u': s += "<uint";  s += dim0Char; s += ">"; break;
    case 'T': s += "<float"; s += dim0Char; s += ">"; break;
    default: break;
    }

    return s;
}